

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_begin_3d(rf_camera3d camera)

{
  rf_vec3 *prVar1;
  rf_vec3 *prVar2;
  rf_vec3 *prVar3;
  rf_mat mat;
  float fVar4;
  double dVar5;
  double right_00;
  int *piVar6;
  float local_e0 [16];
  undefined8 local_a0;
  int local_98;
  undefined8 local_90;
  int local_88;
  undefined8 local_80;
  int local_78;
  undefined1 auStack_70 [8];
  rf_mat mat_view;
  double right_1;
  double top_1;
  double right;
  double top;
  float aspect;
  
  piVar6 = (int *)&stack0x00000008;
  rf_gfx_draw();
  rf_gfx_matrix_mode(RF_PROJECTION);
  rf_gfx_push_matrix();
  rf_gfx_load_identity();
  fVar4 = (float)(rf__ctx->field_0).current_width / (float)(rf__ctx->field_0).current_height;
  if (*piVar6 == 0) {
    dVar5 = tan((double)(float)piVar6[10] * 0.5 * 0.01745329238474369);
    dVar5 = dVar5 * 0.01;
    right_00 = dVar5 * (double)fVar4;
    rf_gfx_frustum(-right_00,right_00,-dVar5,dVar5,0.01,1000.0);
  }
  else if (*piVar6 == 1) {
    dVar5 = (double)(float)piVar6[10] / 2.0;
    mat_view._56_8_ = dVar5 * (double)fVar4;
    rf_gfx_ortho(-(double)mat_view._56_8_,(double)mat_view._56_8_,-dVar5,dVar5,0.01,1000.0);
  }
  rf_gfx_matrix_mode(RF_MODELVIEW);
  rf_gfx_load_identity();
  local_78 = piVar6[3];
  prVar1 = (rf_vec3 *)(piVar6 + 1);
  local_80._0_4_ = prVar1->x;
  local_80._4_4_ = prVar1->y;
  local_88 = piVar6[6];
  prVar2 = (rf_vec3 *)(piVar6 + 4);
  local_90._0_4_ = prVar2->x;
  local_90._4_4_ = prVar2->y;
  local_98 = piVar6[9];
  prVar3 = (rf_vec3 *)(piVar6 + 7);
  local_a0._0_4_ = prVar3->x;
  local_a0._4_4_ = prVar3->y;
  rf_mat_look_at((rf_mat *)auStack_70,*prVar1,*prVar2,*prVar3);
  mat.m8 = mat_view.m8;
  mat.m12 = mat_view.m12;
  mat.m0 = mat_view.m0;
  mat.m4 = mat_view.m4;
  mat.m1 = mat_view.m1;
  mat.m5 = mat_view.m5;
  mat.m9 = mat_view.m9;
  mat.m13 = mat_view.m13;
  mat.m2 = mat_view.m2;
  mat.m6 = mat_view.m6;
  mat.m10 = mat_view.m10;
  mat.m14 = mat_view.m14;
  mat.m3 = mat_view.m3;
  mat.m7 = mat_view.m7;
  mat._56_8_ = piVar6;
  rf_mat_to_float16(mat);
  rf_gfx_mult_matrixf(local_e0);
  rf_gfx_enable_depth_test();
  return;
}

Assistant:

RF_API void rf_begin_3d(rf_camera3d camera)
{
    rf_gfx_draw();

    rf_gfx_matrix_mode(RF_PROJECTION); // Switch to GL_PROJECTION matrix
    rf_gfx_push_matrix(); // Save previous matrix, which contains the settings for the 2d ortho GL_PROJECTION
    rf_gfx_load_identity(); // Reset current matrix (PROJECTION)

    float aspect = (float) rf_ctx.current_width / (float)rf_ctx.current_height;

    if (camera.type == RF_CAMERA_PERSPECTIVE)
    {
        // Setup perspective GL_PROJECTION
        double top = 0.01 * tan(camera.fovy*0.5*RF_DEG2RAD);
        double right = top*aspect;

        rf_gfx_frustum(-right, right, -top, top, 0.01, 1000.0);
    }
    else if (camera.type == RF_CAMERA_ORTHOGRAPHIC)
    {
        // Setup orthographic GL_PROJECTION
        double top = camera.fovy/2.0;
        double right = top*aspect;

        rf_gfx_ortho(-right,right,-top,top, 0.01, 1000.0);
    }

    // NOTE: zNear and zFar values are important when computing depth buffer values

    rf_gfx_matrix_mode(RF_MODELVIEW); // Switch back to rf_gfxobal_model_view matrix
    rf_gfx_load_identity(); // Reset current matrix (MODELVIEW)

    // Setup rf_camera3d view
    rf_mat mat_view = rf_mat_look_at(camera.position, camera.target, camera.up);
    rf_gfx_mult_matrixf(rf_mat_to_float16(mat_view).v); // Multiply MODELVIEW matrix by view matrix (camera)

    rf_gfx_enable_depth_test(); // Enable DEPTH_TEST for 3D
}